

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::CMP_ID_X(CPU *this)

{
  byte bVar1;
  uint16_t address;
  byte bVar2;
  
  this->cycles = 6;
  bVar1 = GetByte(this);
  address = ReadWord(this,(ushort)this->X + (ushort)bVar1);
  bVar1 = ReadByte(this,address);
  this->cycles = this->cycles - 1;
  bVar2 = this->A - bVar1;
  (this->field_6).ps =
       bVar2 & 0x80 | (bVar2 == 0) * '\x02' | bVar1 <= this->A | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CMP_ID_X()
{
    cycles = 6;
    uint8_t op = ReadByte(ReadWord((uint16_t)(GetByte() + X)));
    cycles--;
    uint8_t res = A - op;
    C = (A >= op);
    Z = (A == op);
    N = (res & 0b10000000) > 0;
}